

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<float>::resolve<float_const&>(PromiseData<float> *this,float *value)

{
  PromiseValue<float> local_28;
  float *local_18;
  float *value_local;
  PromiseData<float> *this_local;
  
  local_18 = value;
  value_local = (float *)this;
  PromiseValue<float>::PromiseValue(&local_28,value);
  PromiseValue<float>::operator=(&this->m_value,&local_28);
  PromiseValue<float>::~PromiseValue(&local_28);
  PromiseDataBase<float,_void_(const_float_&)>::setSettled
            (&this->super_PromiseDataBase<float,_void_(const_float_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }